

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteActiveScriptPubKeyMan
          (WalletBatch *this,uint8_t type,uint256 *id,bool internal)

{
  byte bVar1;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  *in_RDI;
  long in_FS_OFFSET;
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 fOverwrite;
  undefined1 *value;
  WalletBatch *in_stack_ffffffffffffff80;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_CL & 1) == 0) {
    value = DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_;
  }
  else {
    value = DBKeys::ACTIVEINTERNALSPK_abi_cxx11_;
  }
  fOverwrite = (undefined1)((ulong)local_28 >> 0x38);
  std::__cxx11::string::string(&in_RDI->first,in_RDX);
  std::make_pair<std::__cxx11::string&,unsigned_char&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (uchar *)in_stack_ffffffffffffff58);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,unsigned_char>,uint256>
                    (in_stack_ffffffffffffff80,in_RDI,(uint256 *)value,(bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  ::~pair(in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff58->first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteActiveScriptPubKeyMan(uint8_t type, const uint256& id, bool internal)
{
    std::string key = internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK;
    return WriteIC(make_pair(key, type), id);
}